

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2_client.cc
# Opt level: O2

void __thiscall common::SSH2Client::Login(SSH2Client *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Log *pLVar4;
  LIBSSH2_CHANNEL *channel;
  ssize_t sVar5;
  ssize_t sVar6;
  long lVar7;
  timeval timeval_out;
  LIBSSH2_POLLFD fdp;
  winsize w_size;
  fd_set set;
  char buffer [32000];
  
  pLVar4 = xlib::Log::Instance();
  std::__cxx11::string::string((string *)buffer,"[%v@%v:%v %v]\n",(allocator *)&set);
  xlib::Log::SWrite<std::__cxx11::string,std::__cxx11::string,unsigned_short,std::__cxx11::string>
            (pLVar4,LOG_PRIORITY_INFO,
             "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/ssh2_client.cc"
             ,0x142,"Login",false,(string *)buffer,&this->m_user,&this->m_ip,&this->m_port,
             &this->m_alias);
  std::__cxx11::string::~string((string *)buffer);
  do {
    channel = libssh2_channel_open_ex(this->session,"session",7,0x200000,0x8000,(char *)0x0,0);
    this->channel = channel;
    if (channel != (LIBSSH2_CHANNEL *)0x0) {
LAB_001104d6:
      iVar2 = libssh2_channel_request_pty_ex(channel,"xterm",5,(char *)0x0,0,0x50,0x18,0,0);
      if (iVar2 == 0) {
        iVar2 = libssh2_channel_process_startup(this->channel,"shell",5,(char *)0x0,0);
        if (iVar2 == 0) {
          iVar2 = RawMode(this);
          this->rc = iVar2;
          if (iVar2 == 0) {
            w_size.ws_row = 0;
            w_size.ws_col = 0;
            w_size.ws_xpixel = 0;
            w_size.ws_ypixel = 0;
            iVar2 = fileno(_stdin);
            ioctl(iVar2,0x5413,&w_size);
            if (w_size.ws_row != 0 || w_size.ws_col != 0) {
              libssh2_channel_request_pty_size_ex
                        (this->channel,(uint)w_size.ws_col,(uint)w_size.ws_row,0,0);
            }
            fdp.type = '\x02';
            fdp.fd = (anon_union_8_3_a559ac02_for_fd)this->channel;
            fdp.events = 1;
            timeval_out.tv_sec = 0;
            timeval_out.tv_usec = 0x32;
            lVar7 = 0;
            do {
              do {
                for (; lVar7 != 0x10; lVar7 = lVar7 + 1) {
                  set.fds_bits[lVar7] = 0;
                }
                iVar2 = fileno(_stdin);
                iVar3 = fileno(_stdin);
                set.fds_bits[iVar3 / 0x40] =
                     set.fds_bits[iVar3 / 0x40] | 1L << ((byte)(iVar2 % 0x40) & 0x3f);
                iVar2 = fileno(_stdin);
                iVar2 = select(iVar2 + 1,(fd_set *)&set,(fd_set *)0x0,(fd_set *)0x0,
                               (timeval *)&timeval_out);
                this->rc = iVar2;
                if (0 < iVar2) {
                  iVar2 = fileno(_stdin);
                  sVar5 = read(iVar2,buffer,32000);
                  this->rc = (int)sVar5;
                  if (0 < (int)sVar5) {
                    do {
                      sVar6 = libssh2_channel_write_ex(this->channel,0,buffer,(long)this->rc);
                    } while ((int)sVar6 == -0x25);
                  }
                }
                iVar2 = libssh2_poll(&fdp,1,0);
                this->rc = iVar2;
                lVar7 = 0;
              } while (iVar2 < 1);
              cVar1 = (char)fdp.revents;
              if ((fdp.revents & 1) != 0) {
                sVar6 = libssh2_channel_read_ex(this->channel,0,buffer,32000);
                write(1,buffer,(long)(int)sVar6);
                fflush(_stdout);
                cVar1 = (char)fdp.revents;
              }
              lVar7 = 0;
            } while (-1 < cVar1);
            NormalMode(this);
            return;
          }
          pLVar4 = xlib::Log::Instance();
          std::__cxx11::string::string((string *)buffer,"raw mode error",(allocator *)&set);
          xlib::Log::SWrite<>(pLVar4,LOG_PRIORITY_FATAL,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/ssh2_client.cc"
                              ,0x155,"Login",true,(string *)buffer);
        }
        else {
          pLVar4 = xlib::Log::Instance();
          std::__cxx11::string::string((string *)buffer,"open shell fail",(allocator *)&set);
          xlib::Log::SWrite<>(pLVar4,LOG_PRIORITY_FATAL,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/ssh2_client.cc"
                              ,0x151,"Login",true,(string *)buffer);
        }
      }
      else {
        pLVar4 = xlib::Log::Instance();
        std::__cxx11::string::string((string *)buffer,"request pty fail",(allocator *)&set);
        xlib::Log::SWrite<>(pLVar4,LOG_PRIORITY_FATAL,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/ssh2_client.cc"
                            ,0x14e,"Login",true,(string *)buffer);
      }
LAB_00110831:
      std::__cxx11::string::~string((string *)buffer);
      exit(1);
    }
    iVar2 = libssh2_session_last_error(this->session,(char **)0x0,(int *)0x0,0);
    if (iVar2 != -0x25) {
      channel = this->channel;
      if (channel == (LIBSSH2_CHANNEL *)0x0) {
        pLVar4 = xlib::Log::Instance();
        std::__cxx11::string::string((string *)buffer,"channel null",(allocator *)&set);
        xlib::Log::SWrite<>(pLVar4,LOG_PRIORITY_FATAL,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/ssh2_client.cc"
                            ,0x149,"Login",true,(string *)buffer);
        goto LAB_00110831;
      }
      goto LAB_001104d6;
    }
    waitsocket(this->sock,this->session);
  } while( true );
}

Assistant:

void SSH2Client::Login() {
    XLOG("[%v@%v:%v %v]\n", m_user,  m_ip, m_port, m_alias);
    /* Exec non-blocking on the remove host */
    while ( (channel = libssh2_channel_open_session(session)) == NULL &&
           libssh2_session_last_error(session, NULL, NULL, 0) ==
           LIBSSH2_ERROR_EAGAIN ) {
        waitsocket(sock, session);
    }
    IF_XFATAL(channel == NULL, "channel null");

    /* Request a terminal with 'vanilla' terminal emulation
     * See /etc/termcap for more options
     */
    IF_XFATAL(libssh2_channel_request_pty(channel, "xterm"), "request pty fail");

    /* Open a SHELL on that pty */
    IF_XFATAL(libssh2_channel_shell(channel), "open shell fail");


    rc = RawMode();
    IF_XFATAL(rc != 0, "raw mode error");

    struct winsize w_size;
    struct winsize w_size_bck;
    memset(&w_size, 0, sizeof(struct winsize));
    memset(&w_size_bck, 0, sizeof(struct winsize));
    ioctl(fileno(stdin), TIOCGWINSZ, &w_size);
    if ((w_size.ws_row != w_size_bck.ws_row) ||
        (w_size.ws_col != w_size_bck.ws_col))   {
        w_size_bck = w_size;

        libssh2_channel_request_pty_size(channel,
                                         w_size.ws_col,
                                         w_size.ws_row);
    }

    LIBSSH2_POLLFD fdp;
    LIBSSH2_POLLFD* fds = &fdp;
    fds[0].type = LIBSSH2_POLLFD_CHANNEL;
    fds[0].fd.channel = channel;
    fds[0].events = LIBSSH2_POLLFD_POLLIN;

    char buffer[32000];

    struct timeval timeval_out;
    timeval_out.tv_sec = 0;
    timeval_out.tv_usec = 50;

    fd_set set;

    while (1) {
        FD_ZERO(&set);
        FD_SET(fileno(stdin), &set);

        rc = select(fileno(stdin)+1, &set, NULL, NULL, &timeval_out);
        if (rc > 0) {
            rc = read(fileno(stdin), buffer, sizeof(buffer));
            if (rc > 0) {
                int ret;
                while ((ret = libssh2_channel_write(channel, buffer, rc)) == LIBSSH2_ERROR_EAGAIN) {}
            }
        }
        rc = libssh2_poll(fds, 1, 0);
        if (rc < 1)
            continue;

        if (fds[0].revents & LIBSSH2_POLLFD_POLLIN) {
            int n = libssh2_channel_read(channel, buffer, sizeof(buffer));
            write(1, buffer, n);
            fflush(stdout);
        }

        if (fds[0].revents & LIBSSH2_POLLFD_CHANNEL_CLOSED) {
            // fprintf(stdout, "%s\n", "closed");
            break;
        }
    }
    NormalMode();
}